

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O3

void __thiscall wasm::ReorderFunctions::run(ReorderFunctions *this,Module *module)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ElementSegment *pEVar5;
  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
  __first;
  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
  __last;
  long lVar6;
  bool bVar7;
  mapped_type *pmVar8;
  pointer ppEVar9;
  ulong uVar10;
  pointer ppEVar11;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar12;
  pointer puVar13;
  ulong uVar14;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar15;
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  local_180;
  undefined1 *local_78;
  undefined1 local_70 [8];
  NameCountMap counts;
  
  local_70 = (undefined1  [8])&counts._M_h._M_rehash_policy._M_next_resize;
  counts._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  counts._M_h._M_bucket_count = 0;
  counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  counts._M_h._M_element_count._0_4_ = 0x3f800000;
  counts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  counts._M_h._M_rehash_policy._4_4_ = 0;
  counts._M_h._M_rehash_policy._M_next_resize = 0;
  puVar12 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar2) {
    do {
      std::__detail::
      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)local_70,
                   (key_type *)
                   (puVar12->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
  }
  paVar1 = &local_180.super_Pass.name.field_2;
  local_180.super_Pass.runner = (PassRunner *)0x0;
  local_180.super_Pass.name._M_string_length = 0;
  local_180.super_Pass.name.field_2._M_local_buf[0] = '\0';
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.replacep =
       (Expression **)0x0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.usedFixed
       = 0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_180.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.currModule =
       (Module *)0x0;
  local_180.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_00d75b50;
  local_78 = local_70;
  local_180.super_Pass.name._M_dataplus._M_p = (pointer)paVar1;
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  ::run(&local_180,(this->super_Pass).runner,module);
  if (local_180.
      super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
      super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.
      flexible.
      super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.
                    super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                    .
                    super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                          .
                          super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                          .
                          super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_180.super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.super_Pass.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_180.super_Pass.name._M_dataplus._M_p,
                    CONCAT71(local_180.super_Pass.name.field_2._M_allocated_capacity._1_7_,
                             local_180.super_Pass.name.field_2._M_local_buf[0]) + 1);
  }
  if ((module->start).super_IString.str._M_str != (char *)0x0) {
    pmVar8 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_70,&module->start);
    LOCK();
    (pmVar8->super___atomic_base<unsigned_int>)._M_i =
         (pmVar8->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  puVar13 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar3) {
    do {
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_70,
                            &((puVar13->_M_t).
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->value);
      LOCK();
      (pmVar8->super___atomic_base<unsigned_int>)._M_i =
           (pmVar8->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar3);
  }
  puVar15 = (module->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  counts._M_h._M_single_bucket = (__node_base_ptr)module;
  if (puVar15 != puVar4) {
    do {
      pEVar5 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      bVar7 = wasm::Type::isFunction(&pEVar5->type);
      if (bVar7) {
        ppEVar9 = *(pointer *)
                   &(pEVar5->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl;
        ppEVar11 = *(pointer *)
                    ((long)&(pEVar5->data).
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    + 8);
        if (ppEVar11 != ppEVar9) {
          uVar10 = 0;
          uVar14 = 1;
          do {
            if (ppEVar9[uVar10]->_id == RefFuncId) {
              pmVar8 = std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_70,(key_type *)(ppEVar9[uVar10] + 1));
              LOCK();
              (pmVar8->super___atomic_base<unsigned_int>)._M_i =
                   (pmVar8->super___atomic_base<unsigned_int>)._M_i + 1;
              UNLOCK();
              ppEVar9 = *(pointer *)
                         &(pEVar5->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl;
              ppEVar11 = *(pointer *)
                          ((long)&(pEVar5->data).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          + 8);
            }
            bVar7 = uVar14 < (ulong)((long)ppEVar11 - (long)ppEVar9 >> 3);
            uVar10 = uVar14;
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (bVar7);
        }
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar4);
  }
  __first._M_current =
       (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
       counts._M_h._M_single_bucket[3]._M_nxt;
  __last._M_current =
       (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
       counts._M_h._M_single_bucket[4]._M_nxt;
  if (__first._M_current != __last._M_current) {
    uVar10 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderFunctions::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&,std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&)_1_>>
              (__first,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderFunctions_cpp:88:15)>
                )local_70);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderFunctions::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&,std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderFunctions_cpp:88:15)>
                )local_70);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_70);
  return;
}

Assistant:

void run(Module* module) override {
    NameCountMap counts;
    // fill in info, as we operate on it in parallel (each function to its own
    // entry)
    for (auto& func : module->functions) {
      counts[func->name];
    }
    // find counts on function calls
    CallCountScanner(&counts).run(getPassRunner(), module);
    // find counts on global usages
    if (module->start.is()) {
      counts[module->start]++;
    }
    for (auto& curr : module->exports) {
      counts[curr->value]++;
    }
    ElementUtils::iterAllElementFunctionNames(
      module, [&](Name& name) { counts[name]++; });
    // TODO: count all RefFunc as well
    // TODO: count the declaration section as well, which adds another mention
    // sort
    std::sort(module->functions.begin(),
              module->functions.end(),
              [&counts](const std::unique_ptr<Function>& a,
                        const std::unique_ptr<Function>& b) -> bool {
                if (counts[a->name] == counts[b->name]) {
                  return a->name > b->name;
                }
                return counts[a->name] > counts[b->name];
              });
  }